

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

void get_num_nodes<long>(ExtIsoForest *model_outputs,long *n_nodes,long *n_terminal,int nthreads)

{
  bool bVar1;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *pvVar2;
  const_reference this;
  size_type sVar3;
  reference pIVar4;
  __normal_iterator<const_IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_> *in_RDX;
  long in_RSI;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *in_RDI;
  IsoHPlane *node;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  size_t hplane;
  long *in_stack_ffffffffffffffa8;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *this_00;
  __normal_iterator<const_IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_> local_38
  ;
  const_reference local_30;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *local_28;
  undefined4 local_20;
  __normal_iterator<const_IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>
  *local_18;
  long local_10;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ::size(in_RDI);
  local_20 = 0;
  std::fill<long*,int>((long *)in_RDX,in_stack_ffffffffffffffa8,(int *)0x1bebe6);
  local_28 = (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x0;
  while( true ) {
    this_00 = local_28;
    pvVar2 = (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
             std::
             vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ::size(local_8);
    if (pvVar2 <= this_00) break;
    this = std::
           vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ::operator[](local_8,(size_type)local_28);
    sVar3 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::size(this);
    *(size_type *)(local_10 + (long)local_28 * 8) = sVar3;
    local_30 = std::
               vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ::operator[](local_8,(size_type)local_28);
    local_38._M_current =
         (IsoHPlane *)std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::begin(this_00);
    std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_RDX,(__normal_iterator<const_IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>
                                 *)this_00);
      if (!bVar1) break;
      pIVar4 = __gnu_cxx::
               __normal_iterator<const_IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>
               ::operator*(&local_38);
      local_18[(long)local_28]._M_current =
           (IsoHPlane *)
           ((long)&((local_18[(long)local_28]._M_current)->col_num).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + (ulong)(pIVar4->hplane_left == 0));
      __gnu_cxx::
      __normal_iterator<const_IsoHPlane_*,_std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>::
      operator++(&local_38);
    }
    local_28 = (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
               ((long)&(local_28->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl
                       .super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void get_num_nodes(const ExtIsoForest &model_outputs, sparse_ix *restrict n_nodes, sparse_ix *restrict n_terminal, int nthreads) noexcept
{
    std::fill(n_terminal, n_terminal + model_outputs.hplanes.size(), 0);
    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(model_outputs, n_nodes, n_terminal)
    for (size_t_for hplane = 0; hplane <(decltype(hplane)) model_outputs.hplanes.size(); hplane++)
    {
        n_nodes[hplane] = model_outputs.hplanes[hplane].size();
        for (const IsoHPlane &node : model_outputs.hplanes[hplane])
        {
            n_terminal[hplane] += (node.hplane_left == 0);
        }
    }
}